

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_injection(_Mem *mem,double n)

{
  Code *rstdin;
  Code *pCVar1;
  uint64_t time;
  Fact *this;
  Code *pCVar2;
  long lVar3;
  DebugStream *this_00;
  double i;
  undefined1 local_6a [2];
  long local_68;
  double local_60;
  undefined8 local_58;
  string local_50 [32];
  
  local_60 = n;
  rstdin = (Code *)r_exec::_Mem::get_stdin();
  local_68 = (*r_exec::Now)();
  i = 0.0;
  while (i < local_60) {
    pCVar2 = rstdin;
    local_58 = i;
    pCVar1 = make_object(mem,rstdin,i);
    time = (*r_exec::Now)();
    this = (Fact *)r_exec::Fact::operator_new((Fact *)0x150,(ulong)pCVar2);
    r_exec::Fact::Fact(this,pCVar1,time,time,1.0,1.0);
    pCVar2 = (Code *)build_view(time,rstdin);
    r_exec::View::set_object(pCVar2);
    r_exec::_Mem::inject((View *)mem);
    i = (double)local_58 + 1.0;
  }
  lVar3 = (*r_exec::Now)();
  std::__cxx11::string::string(local_50,"main",(allocator *)(local_6a + 1));
  debug((string *)local_6a);
  this_00 = DebugStream::operator<<((DebugStream *)local_6a,"for-loop total time: ");
  DebugStream::operator<<(this_00,lVar3 - local_68);
  DebugStream::~DebugStream((DebugStream *)local_6a);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void test_injection(r_exec::_Mem *mem, double n)
{
    Code* rstdin = mem->get_stdin();
    // mem->timings_report.clear();
    // uint64_t tt1 = 0;
    // uint64_t tt2 = 0;
    // uint64_t tt3 = 0;
    // uint64_t tt4 = 0;
    // std::vector<uint64> v1, v2, v3, v4;
    // v1.reserve(n);
    // v2.reserve(n);
    // v3.reserve(n);
    // v4.reserve(n);
    uint64_t t0 = r_exec::Now();

    for (double i = 0; i < n; ++i) {
        // tt1 = r_exec::Now();
        Code* object = make_object(mem, rstdin, i);
        uint64_t now = r_exec::Now();
        // v1.push_back(now - tt1);
        // Build a fact.
        // tt2 = now;
        Code *fact = new r_exec::Fact(object, now, now, 1, 1);
        // uint64_t tt = r_exec::Now();
        // v2.push_back(tt - tt2);
        // Build a default view for the fact.
        // tt3 = tt;
        r_exec::View *view = build_view(now, rstdin);
        // tt = r_exec::Now();
        // v3.push_back(tt - tt3);
        // Inject the view.
        // tt4 = tt;
        view->set_object(fact);
        mem->inject(view);
        // v4.push_back(r_exec::Now() - tt4);
    }

    uint64_t t1 = r_exec::Now();
    uint64_t t2 = t1 - t0;
    debug("main") << "for-loop total time: " << t2;
    /* uint64_t acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v1[i];
    std::cout<<v1[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time make_object: "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v2[i];
    // std::cout<<v2[i]<<'/'<<mem->timings_report[i]<<'\t';
    std::cout<<v2[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time new Fact : "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v3[i];
    std::cout<<v3[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time build_view : "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v4[i];
    std::cout<<v4[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time mem->inject: "<<acc<< std::endl;
    */
}